

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *window;
  ImDrawData *pIVar4;
  _func_void_ImDrawData_ptr *p_Var5;
  undefined1 auVar6 [16];
  ImGuiContext *pIVar7;
  bool bVar8;
  undefined4 extraout_EAX;
  uint uVar9;
  ImDrawList *pIVar10;
  ImDrawList **ppIVar11;
  int iVar12;
  ImGuiWindow *pIVar13;
  bool bVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ImGuiWindow *pIVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  ImVec2 uv [4];
  ImVec2 local_98;
  float local_88;
  float fStack_84;
  float local_78;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar7 = GImGui;
  iVar20 = GImGui->FrameCountEnded;
  if (iVar20 != GImGui->FrameCount) {
    EndFrame();
    iVar20 = pIVar7->FrameCount;
  }
  pIVar7->FrameCountRendered = iVar20;
  (pIVar7->IO).MetricsRenderWindows = 0;
  (pIVar7->IO).MetricsRenderVertices = 0;
  (pIVar7->IO).MetricsRenderIndices = 0;
  if ((pIVar7->Viewports).Size != 0) {
    uVar16 = 0;
    do {
      pIVar3 = (pIVar7->Viewports).Data[uVar16];
      ImDrawDataBuilder::Clear(&pIVar3->DrawDataBuilder);
      if (pIVar3->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar3,0,"##Background");
        AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar10);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)(pIVar7->Viewports).Size);
  }
  pIVar13 = pIVar7->NavWindowingTarget;
  if (pIVar13 == (ImGuiWindow *)0x0) {
    pIVar13 = (ImGuiWindow *)0x0;
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar13->Flags & 0x2000) == 0) {
      pIVar13 = pIVar13->RootWindow;
    }
    else {
      pIVar13 = (ImGuiWindow *)0x0;
    }
    pIVar18 = pIVar7->NavWindowingList;
  }
  uVar9 = (pIVar7->Windows).Size;
  uVar16 = (ulong)uVar9;
  if (uVar9 != 0) {
    uVar19 = 0;
    do {
      window = (pIVar7->Windows).Data[uVar19];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar18 && window != pIVar13) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        uVar16 = (ulong)(uint)(pIVar7->Windows).Size;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar16);
  }
  bVar8 = true;
  do {
    bVar14 = bVar8;
    if (((pIVar13 != (ImGuiWindow *)0x0) && (pIVar13->Active == true)) && (pIVar13->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar13,(uint)pIVar13->Flags >> 0x19 & 1);
    }
    pIVar13 = pIVar18;
    bVar8 = false;
  } while (bVar14);
  local_88 = 0.0;
  fStack_84 = 0.0;
  local_78 = 0.0;
  if ((pIVar7->IO).MouseDrawCursor == false) {
    local_98.x = 0.0;
    local_98.y = 0.0;
  }
  else {
    local_98.x = 0.0;
    local_98.y = 0.0;
    if (pIVar7->MouseCursor != -1) {
      local_60.x = 0.0;
      local_60.y = 0.0;
      local_68.x = 0.0;
      local_68.y = 0.0;
      local_48.x = 0.0;
      local_48.y = 0.0;
      uStack_40 = 0;
      local_88 = 0.0;
      fStack_84 = 0.0;
      local_58.x = 0.0;
      local_58.y = 0.0;
      uStack_50 = 0;
      bVar8 = ImFontAtlas::GetMouseCursorTexData
                        ((pIVar7->IO).Fonts,pIVar7->MouseCursor,&local_60,&local_68,&local_58,
                         &local_48);
      local_78 = 0.0;
      local_98.x = 0.0;
      local_98.y = 0.0;
      if (bVar8) {
        fVar22 = (pIVar7->Style).MouseCursorScale;
        local_98 = (pIVar7->IO).MousePos;
        local_78 = local_98.y;
        local_88 = fVar22 * (local_68.x + 2.0) + local_98.x;
        fStack_84 = fVar22 * (local_68.y + 2.0) + local_78;
      }
    }
  }
  (pIVar7->IO).MetricsRenderVertices = 0;
  (pIVar7->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar7->Viewports).Size) {
    lVar17 = 0;
    do {
      pIVar3 = (pIVar7->Viewports).Data[lVar17];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar3->DrawDataBuilder);
      IVar2 = (pIVar3->super_ImGuiViewport).Pos;
      fVar22 = IVar2.x;
      fVar23 = IVar2.y;
      if (((local_78 < fVar23 + (pIVar3->super_ImGuiViewport).Size.y) &&
          (iVar20 = -(uint)(fVar22 < local_88), iVar21 = -(uint)(fVar23 < fStack_84),
          auVar6._4_4_ = iVar20, auVar6._0_4_ = iVar20, auVar6._8_4_ = iVar21,
          auVar6._12_4_ = iVar21, uVar9 = movmskpd(extraout_EAX,auVar6),
          (byte)((byte)uVar9 >> 1) != 0)) &&
         ((local_98.x < fVar22 + (pIVar3->super_ImGuiViewport).Size.x && ((uVar9 & 1) != 0)))) {
        pIVar10 = GetViewportDrawList(pIVar3,1,"##Foreground");
        RenderMouseCursor(pIVar10,(pIVar7->IO).MousePos,(pIVar7->Style).MouseCursorScale,
                          pIVar7->MouseCursor,0xffffffff,0xff000000,0x30000000);
      }
      if (pIVar3->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar3,1,"##Foreground");
        AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar10);
      }
      (pIVar3->super_ImGuiViewport).DrawData = &pIVar3->DrawDataP;
      (pIVar3->DrawDataP).Valid = true;
      iVar20 = (pIVar3->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar20 < 1) {
        ppIVar11 = (ImDrawList **)0x0;
      }
      else {
        ppIVar11 = (pIVar3->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar3->DrawDataP).CmdLists = ppIVar11;
      (pIVar3->DrawDataP).CmdListsCount = iVar20;
      (pIVar3->DrawDataP).TotalIdxCount = 0;
      (pIVar3->DrawDataP).TotalVtxCount = 0;
      IVar2 = (pIVar3->super_ImGuiViewport).Size;
      (pIVar3->DrawDataP).DisplayPos = (pIVar3->super_ImGuiViewport).Pos;
      (pIVar3->DrawDataP).DisplaySize = IVar2;
      (pIVar3->DrawDataP).FramebufferScale = (GImGui->IO).DisplayFramebufferScale;
      (pIVar3->DrawDataP).OwnerViewport = &pIVar3->super_ImGuiViewport;
      if (iVar20 < 1) {
        iVar21 = 0;
        iVar12 = 0;
      }
      else {
        lVar15 = 0;
        iVar21 = 0;
        iVar12 = 0;
        do {
          pIVar10 = (pIVar3->DrawDataBuilder).Layers[0].Data[lVar15];
          iVar12 = iVar12 + (pIVar10->VtxBuffer).Size;
          iVar21 = iVar21 + (pIVar10->IdxBuffer).Size;
          lVar15 = lVar15 + 1;
        } while (iVar20 != lVar15);
        (pIVar3->DrawDataP).TotalVtxCount = iVar12;
        (pIVar3->DrawDataP).TotalIdxCount = iVar21;
      }
      piVar1 = &(pIVar7->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar12;
      piVar1 = &(pIVar7->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + iVar21;
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pIVar7->Viewports).Size);
  }
  pIVar4 = ((*(pIVar7->Viewports).Data)->super_ImGuiViewport).DrawData;
  if ((0 < pIVar4->CmdListsCount) &&
     (p_Var5 = (pIVar7->IO).RenderDrawListsFn, p_Var5 != (_func_void_ImDrawData_ptr *)0x0)) {
    (*p_Var5)(pIVar4);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render (for each active window)
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingList : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the tp-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested
    ImRect mouse_cursor_rect;
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
    {
        ImVec2 offset, size, uv[4];
        if (g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
            mouse_cursor_rect = ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(size.x + 2, size.y + 2) * g.Style.MouseCursorScale);
    }

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        if (viewport->GetRect().Overlaps(mouse_cursor_rect))
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        g.IO.MetricsRenderVertices += viewport->DrawData->TotalVtxCount;
        g.IO.MetricsRenderIndices += viewport->DrawData->TotalIdxCount;
    }

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.Viewports[0]->DrawData->CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(g.Viewports[0]->DrawData);
#endif
}